

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemmodel.cpp
# Opt level: O0

int __thiscall QAbstractItemModel::qt_metacall(QAbstractItemModel *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  void **in_stack_000002b0;
  int in_stack_000002b8;
  Call in_stack_000002bc;
  QObject *in_stack_000002c0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = QObject::qt_metacall
                    ((QObject *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (Call)((ulong)in_RDI >> 0x20),(int)in_RDI,(void **)CONCAT44(in_ESI,in_EDX));
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 0x48) {
        qt_static_metacall(in_stack_000002c0,in_stack_000002bc,in_stack_000002b8,in_stack_000002b0);
      }
      iVar1 = iVar1 + -0x48;
    }
    if (in_ESI == 7) {
      if (iVar1 < 0x48) {
        qt_static_metacall(in_stack_000002c0,in_stack_000002bc,in_stack_000002b8,in_stack_000002b0);
      }
      iVar1 = iVar1 + -0x48;
    }
  }
  return iVar1;
}

Assistant:

int QAbstractItemModel::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 72)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 72;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 72)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 72;
    }
    return _id;
}